

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

NodeIterator __thiscall
DirectChainedMap<TypeFunction_*>::first(DirectChainedMap<TypeFunction_*> *this,uint hash)

{
  Node *start_00;
  Node *local_40;
  Node *curr;
  Node *start;
  uint bucket;
  uint bucketMask;
  uint hash_local;
  DirectChainedMap<TypeFunction_*> *this_local;
  
  start_00 = this->data + (ulong)(hash & this->bucketCount - 1) * 0x18;
  local_40 = start_00;
  if (*(long *)(start_00 + 0x10) == 0) {
    NodeIterator::NodeIterator((NodeIterator *)&this_local);
  }
  else {
    do {
      if (local_40 == (Node *)0x0) {
        NodeIterator::NodeIterator((NodeIterator *)&this_local);
        return _this_local;
      }
      if (*(uint *)local_40 == hash) {
        NodeIterator::NodeIterator((NodeIterator *)&this_local,start_00,local_40);
        return _this_local;
      }
      local_40 = *(Node **)(local_40 + 0x10);
    } while (local_40 != start_00);
    NodeIterator::NodeIterator((NodeIterator *)&this_local);
  }
  return _this_local;
}

Assistant:

NodeIterator first(unsigned hash)
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = hash & bucketMask;

		Node *start = &data[bucket];
		Node *curr = start;

		if(!curr->next)
			return NodeIterator();

		while(curr)
		{
			if(curr->hash == hash)
				return NodeIterator(start, curr);

			curr = curr->next;

			if(curr == start)
				return NodeIterator();
		}

		return NodeIterator();
	}